

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportLibraryDependenciesCommand.cxx
# Opt level: O0

void __thiscall
cmExportLibraryDependenciesCommand::ConstFinalPass(cmExportLibraryDependenciesCommand *this)

{
  LinkLibraryType LVar1;
  byte bVar2;
  bool bVar3;
  TargetType TVar4;
  basic_ofstream<char,_std::char_traits<char>_> *pbVar5;
  char *pcVar6;
  cmGeneratedFileStream *pcVar7;
  cmake *this_00;
  cmGlobalGenerator *this_01;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_02;
  reference ppcVar8;
  cmMakefile *this_03;
  pointer pvVar9;
  string *psVar10;
  pointer ppVar11;
  cmTarget *pcVar12;
  mapped_type *pmVar13;
  ostream *poVar14;
  ulong uVar15;
  pointer ppVar16;
  iterator local_2a8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a0;
  iterator local_298;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  const_iterator i_3;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_280;
  iterator local_278;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270;
  const_iterator i_2;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_260;
  iterator local_258;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_250;
  const_iterator i_1;
  char *vertest;
  string *ltEntry;
  string local_230;
  char *local_210;
  char *outname;
  cmTarget *libtgt;
  string lib;
  string ltValue;
  string ltVar;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>_>
  local_198;
  const_iterator li;
  LinkLibraryVectorType *libs;
  string valueNew;
  string valueOld;
  string targetEntry;
  cmTarget *target;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  local_118;
  const_iterator l;
  cmTargets *tgts;
  cmLocalGenerator *gen;
  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  local_f8;
  const_iterator i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  libTypes;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  libDepsNew;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  libDepsOld;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *locals;
  cmGlobalGenerator *global;
  cmake *cm;
  ostream *fout;
  auto_ptr<cmGeneratedFileStream> ap_1;
  auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> local_20;
  auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> ap;
  auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> foutPtr;
  cmExportLibraryDependenciesCommand *this_local;
  
  cmsys::auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::auto_ptr
            (&ap,(basic_ofstream<char,_std::char_traits<char>_> *)0x0);
  if ((this->Append & 1U) == 0) {
    pcVar7 = (cmGeneratedFileStream *)operator_new(0x248);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmGeneratedFileStream::cmGeneratedFileStream(pcVar7,pcVar6,true);
    cmsys::auto_ptr<cmGeneratedFileStream>::auto_ptr
              ((auto_ptr<cmGeneratedFileStream> *)&fout,pcVar7);
    pcVar7 = cmsys::auto_ptr<cmGeneratedFileStream>::operator->
                       ((auto_ptr<cmGeneratedFileStream> *)&fout);
    cmGeneratedFileStream::SetCopyIfDifferent(pcVar7,true);
    cmsys::auto_ptr<std::ofstream>::operator=
              ((auto_ptr<std::ofstream> *)&ap,(auto_ptr<cmGeneratedFileStream> *)&fout);
    cmsys::auto_ptr<cmGeneratedFileStream>::~auto_ptr((auto_ptr<cmGeneratedFileStream> *)&fout);
  }
  else {
    pbVar5 = (basic_ofstream<char,_std::char_traits<char>_> *)operator_new(0x200);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(pbVar5,pcVar6,_S_app);
    cmsys::auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::auto_ptr(&local_20,pbVar5)
    ;
    cmsys::auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::operator=(&ap,&local_20);
    cmsys::auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::~auto_ptr(&local_20);
  }
  pbVar5 = cmsys::auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::get(&ap);
  bVar2 = std::ios::operator!((ios *)((long)&(pbVar5->
                                             super_basic_ostream<char,_std::char_traits<char>_>).
                                             _vptr_basic_ostream +
                                     (long)(pbVar5->
                                           super_basic_ostream<char,_std::char_traits<char>_>).
                                           _vptr_basic_ostream[-3]));
  if ((bVar2 & 1) == 0) {
    this_00 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    this_01 = cmake::GetGlobalGenerator(this_00);
    this_02 = cmGlobalGenerator::GetLocalGenerators(this_01);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&libDepsNew._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&libTypes._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&i);
    local_f8._M_current =
         (cmLocalGenerator **)
         std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(this_02);
    while( true ) {
      gen = (cmLocalGenerator *)
            std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(this_02);
      bVar3 = __gnu_cxx::operator!=
                        (&local_f8,
                         (__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                          *)&gen);
      if (!bVar3) break;
      ppcVar8 = __gnu_cxx::
                __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                ::operator*(&local_f8);
      this_03 = cmLocalGenerator::GetMakefile(*ppcVar8);
      l.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
      ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                 )cmMakefile::GetTargets_abi_cxx11_(this_03);
      local_118._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
           ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                    *)l.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                      ._M_cur);
      while( true ) {
        target = (cmTarget *)
                 std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                 ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                        *)l.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                          ._M_cur);
        bVar3 = std::__detail::operator!=
                          (&local_118,
                           (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                            *)&target);
        if (!bVar3) break;
        pvVar9 = std::__detail::
                 _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                 ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                               *)&local_118);
        pcVar12 = &pvVar9->second;
        TVar4 = cmTarget::GetType(pcVar12);
        if ((0 < (int)TVar4) && (TVar4 = cmTarget::GetType(pcVar12), (int)TVar4 < 4)) {
          psVar10 = cmTarget::GetName_abi_cxx11_(pcVar12);
          std::__cxx11::string::string
                    ((string *)(valueOld.field_2._M_local_buf + 8),(string *)psVar10);
          std::__cxx11::string::operator+=
                    ((string *)(valueOld.field_2._M_local_buf + 8),"_LIB_DEPENDS");
          std::__cxx11::string::string((string *)(valueNew.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)&libs);
          li._M_current =
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>
                *)cmTarget::GetOriginalLinkLibraries_abi_cxx11_(pcVar12);
          local_198._M_current =
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>
                *)std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
                  ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
                           *)li._M_current);
          while( true ) {
            ltVar.field_2._8_8_ =
                 std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
                 ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
                        *)li._M_current);
            bVar3 = __gnu_cxx::operator!=
                              (&local_198,
                               (__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>_>
                                *)((long)&ltVar.field_2 + 8));
            if (!bVar3) break;
            ppVar11 = __gnu_cxx::
                      __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>_>
                      ::operator->(&local_198);
            std::__cxx11::string::string
                      ((string *)(ltValue.field_2._M_local_buf + 8),(string *)ppVar11);
            std::__cxx11::string::operator+=
                      ((string *)(ltValue.field_2._M_local_buf + 8),"_LINK_TYPE");
            std::__cxx11::string::string((string *)(lib.field_2._M_local_buf + 8));
            ppVar11 = __gnu_cxx::
                      __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>_>
                      ::operator->(&local_198);
            LVar1 = ppVar11->second;
            if (LVar1 == GENERAL) {
              std::__cxx11::string::operator+=((string *)&libs,"general;");
              std::__cxx11::string::operator=((string *)(lib.field_2._M_local_buf + 8),"general");
            }
            else if (LVar1 == DEBUG) {
              std::__cxx11::string::operator+=((string *)&libs,"debug;");
              std::__cxx11::string::operator=((string *)(lib.field_2._M_local_buf + 8),"debug");
            }
            else if (LVar1 == OPTIMIZED) {
              std::__cxx11::string::operator+=((string *)&libs,"optimized;");
              std::__cxx11::string::operator=((string *)(lib.field_2._M_local_buf + 8),"optimized");
            }
            ppVar11 = __gnu_cxx::
                      __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>_>
                      ::operator->(&local_198);
            std::__cxx11::string::string((string *)&libtgt,(string *)ppVar11);
            pcVar12 = cmGlobalGenerator::FindTarget(this_01,(string *)&libtgt,false);
            outname = (char *)pcVar12;
            if (pcVar12 != (cmTarget *)0x0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_230,"OUTPUT_NAME",(allocator *)((long)&ltEntry + 7));
              pcVar6 = cmTarget::GetProperty(pcVar12,&local_230);
              std::__cxx11::string::~string((string *)&local_230);
              std::allocator<char>::~allocator((allocator<char> *)((long)&ltEntry + 7));
              local_210 = pcVar6;
              if (pcVar6 != (char *)0x0) {
                std::__cxx11::string::operator=((string *)&libtgt,pcVar6);
              }
            }
            std::__cxx11::string::operator+=
                      ((string *)(valueNew.field_2._M_local_buf + 8),(string *)&libtgt);
            std::__cxx11::string::operator+=((string *)(valueNew.field_2._M_local_buf + 8),";");
            std::__cxx11::string::operator+=((string *)&libs,(string *)&libtgt);
            std::__cxx11::string::operator+=((string *)&libs,";");
            pmVar13 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&i,(key_type *)((long)&ltValue.field_2 + 8));
            uVar15 = std::__cxx11::string::empty();
            if ((uVar15 & 1) == 0) {
              bVar3 = std::operator!=(pmVar13,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)((long)&lib.field_2 + 8));
              if (bVar3) {
                std::__cxx11::string::operator=((string *)pmVar13,"general");
              }
            }
            else {
              std::__cxx11::string::operator=
                        ((string *)pmVar13,(string *)(lib.field_2._M_local_buf + 8));
            }
            std::__cxx11::string::~string((string *)&libtgt);
            std::__cxx11::string::~string((string *)(lib.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(ltValue.field_2._M_local_buf + 8));
            __gnu_cxx::
            __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>_>
            ::operator++(&local_198);
          }
          pmVar13 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&libTypes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                 (key_type *)((long)&valueOld.field_2 + 8));
          std::__cxx11::string::operator=((string *)pmVar13,(string *)&libs);
          pmVar13 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&libDepsNew._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                 (key_type *)((long)&valueOld.field_2 + 8));
          std::__cxx11::string::operator=
                    ((string *)pmVar13,(string *)(valueNew.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&libs);
          std::__cxx11::string::~string((string *)(valueNew.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(valueOld.field_2._M_local_buf + 8));
        }
        std::__detail::
        _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
        ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                      *)&local_118);
      }
      __gnu_cxx::
      __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
      ::operator++(&local_f8);
    }
    i_1._M_node = (_Base_ptr)anon_var_dwarf_1b45c7;
    poVar14 = std::operator<<(&pbVar5->super_basic_ostream<char,_std::char_traits<char>_>,
                              "# Generated by CMake ");
    pcVar6 = cmVersion::GetCMakeVersion();
    poVar14 = std::operator<<(poVar14,pcVar6);
    std::operator<<(poVar14,"\n\n");
    poVar14 = std::operator<<(&pbVar5->super_basic_ostream<char,_std::char_traits<char>_>,"if(");
    poVar14 = std::operator<<(poVar14,(char *)i_1._M_node);
    std::operator<<(poVar14,")\n");
    std::operator<<(&pbVar5->super_basic_ostream<char,_std::char_traits<char>_>,
                    "  # Information for CMake 2.6 and above.\n");
    local_258._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&libTypes._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree_const_iterator(&local_250,&local_258);
    while( true ) {
      i_2._M_node = (_Base_ptr)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&libTypes._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree_const_iterator(&local_260,(iterator *)&i_2);
      bVar3 = std::operator!=(&local_250,&local_260);
      if (!bVar3) break;
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->(&local_250);
      uVar15 = std::__cxx11::string::empty();
      if ((uVar15 & 1) == 0) {
        poVar14 = std::operator<<(&pbVar5->super_basic_ostream<char,_std::char_traits<char>_>,
                                  "  set(\"");
        ppVar16 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator->(&local_250);
        poVar14 = std::operator<<(poVar14,(string *)ppVar16);
        poVar14 = std::operator<<(poVar14,"\" \"");
        ppVar16 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator->(&local_250);
        poVar14 = std::operator<<(poVar14,(string *)&ppVar16->second);
        std::operator<<(poVar14,"\")\n");
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&local_250);
    }
    std::operator<<(&pbVar5->super_basic_ostream<char,_std::char_traits<char>_>,"else()\n");
    std::operator<<(&pbVar5->super_basic_ostream<char,_std::char_traits<char>_>,
                    "  # Information for CMake 2.4 and lower.\n");
    local_278._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&libDepsNew._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree_const_iterator(&local_270,&local_278);
    while( true ) {
      i_3._M_node = (_Base_ptr)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&libDepsNew._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree_const_iterator(&local_280,(iterator *)&i_3);
      bVar3 = std::operator!=(&local_270,&local_280);
      if (!bVar3) break;
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->(&local_270);
      uVar15 = std::__cxx11::string::empty();
      if ((uVar15 & 1) == 0) {
        poVar14 = std::operator<<(&pbVar5->super_basic_ostream<char,_std::char_traits<char>_>,
                                  "  set(\"");
        ppVar16 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator->(&local_270);
        poVar14 = std::operator<<(poVar14,(string *)ppVar16);
        poVar14 = std::operator<<(poVar14,"\" \"");
        ppVar16 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator->(&local_270);
        poVar14 = std::operator<<(poVar14,(string *)&ppVar16->second);
        std::operator<<(poVar14,"\")\n");
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&local_270);
    }
    local_298._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&i);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree_const_iterator(&local_290,&local_298);
    while( true ) {
      local_2a8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&i);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree_const_iterator(&local_2a0,&local_2a8);
      bVar3 = std::operator!=(&local_290,&local_2a0);
      if (!bVar3) break;
      ppVar16 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator->(&local_290);
      bVar3 = std::operator!=(&ppVar16->second,"general");
      if (bVar3) {
        poVar14 = std::operator<<(&pbVar5->super_basic_ostream<char,_std::char_traits<char>_>,
                                  "  set(\"");
        ppVar16 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator->(&local_290);
        poVar14 = std::operator<<(poVar14,(string *)ppVar16);
        poVar14 = std::operator<<(poVar14,"\" \"");
        ppVar16 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator->(&local_290);
        poVar14 = std::operator<<(poVar14,(string *)&ppVar16->second);
        std::operator<<(poVar14,"\")\n");
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&local_290);
    }
    std::operator<<(&pbVar5->super_basic_ostream<char,_std::char_traits<char>_>,"endif()\n");
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&i);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&libTypes._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&libDepsNew._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  else {
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Error("Error Writing ",pcVar6,(char *)0x0,(char *)0x0);
    cmSystemTools::ReportLastSystemError("");
  }
  cmsys::auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::~auto_ptr(&ap);
  return;
}

Assistant:

void cmExportLibraryDependenciesCommand::ConstFinalPass() const
{
  // Use copy-if-different if not appending.
  cmsys::auto_ptr<cmsys::ofstream> foutPtr;
  if(this->Append)
    {
    cmsys::auto_ptr<cmsys::ofstream> ap(
      new cmsys::ofstream(this->Filename.c_str(), std::ios::app));
    foutPtr = ap;
    }
  else
    {
    cmsys::auto_ptr<cmGeneratedFileStream> ap(
      new cmGeneratedFileStream(this->Filename.c_str(), true));
    ap->SetCopyIfDifferent(true);
    foutPtr = ap;
    }
  std::ostream& fout = *foutPtr.get();

  if (!fout)
    {
    cmSystemTools::Error("Error Writing ", this->Filename.c_str());
    cmSystemTools::ReportLastSystemError("");
    return;
    }

  // Collect dependency information about all library targets built in
  // the project.
  cmake* cm = this->Makefile->GetCMakeInstance();
  cmGlobalGenerator* global = cm->GetGlobalGenerator();
  const std::vector<cmLocalGenerator *>& locals = global->GetLocalGenerators();
  std::map<std::string, std::string> libDepsOld;
  std::map<std::string, std::string> libDepsNew;
  std::map<std::string, std::string> libTypes;
  for(std::vector<cmLocalGenerator *>::const_iterator i = locals.begin();
      i != locals.end(); ++i)
    {
    const cmLocalGenerator* gen = *i;
    const cmTargets &tgts = gen->GetMakefile()->GetTargets();
    for(cmTargets::const_iterator l = tgts.begin();
        l != tgts.end(); ++l)
      {
      // Get the current target.
      cmTarget const& target = l->second;

      // Skip non-library targets.
      if(target.GetType() < cmTarget::STATIC_LIBRARY
         || target.GetType() > cmTarget::MODULE_LIBRARY)
        {
        continue;
        }

      // Construct the dependency variable name.
      std::string targetEntry = target.GetName();
      targetEntry += "_LIB_DEPENDS";

      // Construct the dependency variable value with the direct link
      // dependencies.
      std::string valueOld;
      std::string valueNew;
      cmTarget::LinkLibraryVectorType const& libs =
        target.GetOriginalLinkLibraries();
      for(cmTarget::LinkLibraryVectorType::const_iterator li = libs.begin();
          li != libs.end(); ++li)
        {
        std::string ltVar = li->first;
        ltVar += "_LINK_TYPE";
        std::string ltValue;
        switch(li->second)
          {
          case cmTarget::GENERAL:
            valueNew += "general;";
            ltValue = "general";
            break;
          case cmTarget::DEBUG:
            valueNew += "debug;";
            ltValue = "debug";
            break;
          case cmTarget::OPTIMIZED:
            valueNew += "optimized;";
            ltValue = "optimized";
            break;
          }
        std::string lib = li->first;
        if(cmTarget* libtgt = global->FindTarget(lib))
          {
          // Handle simple output name changes.  This command is
          // deprecated so we do not support full target name
          // translation (which requires per-configuration info).
          if(const char* outname = libtgt->GetProperty("OUTPUT_NAME"))
            {
            lib = outname;
            }
          }
        valueOld += lib;
        valueOld += ";";
        valueNew += lib;
        valueNew += ";";

        std::string& ltEntry = libTypes[ltVar];
        if(ltEntry.empty())
          {
          ltEntry = ltValue;
          }
        else if(ltEntry != ltValue)
          {
          ltEntry = "general";
          }
        }
      libDepsNew[targetEntry] = valueNew;
      libDepsOld[targetEntry] = valueOld;
      }
    }

  // Generate dependency information for both old and new style CMake
  // versions.
  const char* vertest =
    "\"${CMAKE_MAJOR_VERSION}.${CMAKE_MINOR_VERSION}\" GREATER 2.4";
  fout << "# Generated by CMake " <<  cmVersion::GetCMakeVersion() << "\n\n";
  fout << "if(" << vertest << ")\n";
  fout << "  # Information for CMake 2.6 and above.\n";
  for(std::map<std::string, std::string>::const_iterator
        i = libDepsNew.begin();
      i != libDepsNew.end(); ++i)
    {
    if(!i->second.empty())
      {
      fout << "  set(\"" << i->first << "\" \"" << i->second << "\")\n";
      }
    }
  fout << "else()\n";
  fout << "  # Information for CMake 2.4 and lower.\n";
  for(std::map<std::string, std::string>::const_iterator
        i = libDepsOld.begin();
      i != libDepsOld.end(); ++i)
    {
    if(!i->second.empty())
      {
      fout << "  set(\"" << i->first << "\" \"" << i->second << "\")\n";
      }
    }
  for(std::map<std::string, std::string>::const_iterator i = libTypes.begin();
      i != libTypes.end(); ++i)
    {
    if(i->second != "general")
      {
      fout << "  set(\"" << i->first << "\" \"" << i->second << "\")\n";
      }
    }
  fout << "endif()\n";
  return;
}